

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int imcomp_copy_comp2img(fitsfile *infptr,fitsfile *outfptr,int norec,int *status)

{
  bool bVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char negative [2];
  int nmore;
  int tstatus;
  int nkeys;
  char card [81];
  char *pcStack_2c0;
  char *patterns [40] [2];
  
  negative[0] = '-';
  negative[1] = '\0';
  tstatus = 0;
  iVar6 = *status;
  if (iVar6 < 1) {
    lVar3 = 8;
    do {
      *(undefined8 *)((long)&pcStack_2c0 + lVar3) = *(undefined8 *)(&UNK_001fd9d8 + lVar3);
      pcVar5 = negative;
      if (norec == 0) {
        pcVar5 = *(char **)((long)&PTR_anon_var_dwarf_64f39_001fd9e0 + lVar3);
      }
      *(char **)((long)patterns[0] + lVar3) = pcVar5;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0xb8);
    lVar3 = 0;
    do {
      uVar2 = *(undefined8 *)(&UNK_001fda98 + lVar3);
      *(undefined8 *)((long)patterns[0xb] + lVar3) = *(undefined8 *)(&DAT_001fda90 + lVar3);
      *(undefined8 *)((long)patterns[0xb] + lVar3 + 8) = uVar2;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x160);
    ffgcrd(infptr,"EXTNAME",card,&tstatus);
    if ((tstatus == 0) &&
       (auVar8[0] = -(card[0xc] == 'O'), auVar8[1] = -(card[0xd] == 'M'),
       auVar8[2] = -(card[0xe] == 'P'), auVar8[3] = -(card[0xf] == 'R'),
       auVar8[4] = -(card[0x10] == 'E'), auVar8[5] = -(card[0x11] == 'S'),
       auVar8[6] = -(card[0x12] == 'S'), auVar8[7] = -(card[0x13] == 'E'),
       auVar8[8] = -(card[0x14] == 'D'), auVar8[9] = -(card[0x15] == '_'),
       auVar8[10] = -(card[0x16] == 'I'), auVar8[0xb] = -(card[0x17] == 'M'),
       auVar8[0xc] = -(card[0x18] == 'A'), auVar8[0xd] = -(card[0x19] == 'G'),
       auVar8[0xe] = -(card[0x1a] == 'E'), auVar8[0xf] = -(card[0x1b] == '\''),
       auVar7[0] = -(card[0] == 'E'), auVar7[1] = -(card[1] == 'X'), auVar7[2] = -(card[2] == 'T'),
       auVar7[3] = -(card[3] == 'N'), auVar7[4] = -(card[4] == 'A'), auVar7[5] = -(card[5] == 'M'),
       auVar7[6] = -(card[6] == 'E'), auVar7[7] = -(card[7] == ' '), auVar7[8] = -(card[8] == '='),
       auVar7[9] = -(card[9] == ' '), auVar7[10] = -(card[10] == '\''),
       auVar7[0xb] = -(card[0xb] == 'C'), auVar7[0xc] = -(card[0xc] == 'O'),
       auVar7[0xd] = -(card[0xd] == 'M'), auVar7[0xe] = -(card[0xe] == 'P'),
       auVar7[0xf] = -(card[0xf] == 'R'), auVar7 = auVar7 & auVar8,
       (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff)) {
      patterns[0x1f][1] = negative;
    }
    iVar6 = 0;
    fits_translate_keywords(infptr,outfptr,1,patterns,0x21,0,0,0,status);
    ffghsp(infptr,&nkeys,&nmore,status);
    bVar1 = 0x23 < nmore;
    nmore = nmore / 0x24;
    if (bVar1) {
      do {
        iVar4 = 0x24;
        do {
          ffprec(outfptr,"    ",status);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        iVar6 = iVar6 + 1;
      } while (iVar6 < nmore);
    }
    iVar6 = *status;
  }
  return iVar6;
}

Assistant:

int imcomp_copy_comp2img(fitsfile *infptr, fitsfile *outfptr, 
                          int norec, int *status)
/*
    This routine copies the header keywords from the compressed input image 
    and to the uncompressed image (in a binary table) 
*/
{
    char card[FLEN_CARD];	/* a header record */
    char *patterns[40][2];
    char negative[] = "-";
    int ii,jj, npat, nreq, nsp, tstatus = 0;
    int nkeys, nmore;
    
    /* tile compressed image keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */

    /*  only translate these if required keywords not already written */
    char *reqkeys[][2] = {  
			   {"ZSIMPLE",   "SIMPLE" },  
			   {"ZTENSION", "XTENSION"},
			   {"ZBITPIX",   "BITPIX" },
			   {"ZNAXIS",    "NAXIS"  },
			   {"ZNAXISm",   "NAXISm" },
			   {"ZEXTEND",   "EXTEND" },
			   {"ZBLOCKED",  "BLOCKED"},
			   {"ZPCOUNT",   "PCOUNT" },  
			   {"ZGCOUNT",   "GCOUNT" },
			   {"ZHECKSUM",  "CHECKSUM"},  /* restore original checksums */
			   {"ZDATASUM",  "DATASUM"}}; 

    /* other special keywords */
    char *spkeys[][2] = {
			   {"XTENSION", "-"      },
			   {"BITPIX",  "-"       },
			   {"NAXIS",   "-"       },
			   {"NAXISm",  "-"       },
			   {"PCOUNT",  "-"       },
			   {"GCOUNT",  "-"       },
			   {"TFIELDS", "-"       },
			   {"TTYPEm",  "-"       },
			   {"TFORMm",  "-"       },
			   {"THEAP",   "-"       },
			   {"ZIMAGE",  "-"       },
			   {"ZQUANTIZ", "-"      },
			   {"ZDITHER0", "-"      },
			   {"ZTILEm",  "-"       },
			   {"ZCMPTYPE", "-"      },
			   {"ZBLANK",  "-"       },
			   {"ZNAMEm",  "-"       },
			   {"ZVALm",   "-"       },

			   {"CHECKSUM","-"       },  /* delete checksums */
			   {"DATASUM", "-"       },
			   {"EXTNAME", "+"       },  /* we may change this, below */
			   {"*",       "+"      }};  


    if (*status > 0)
        return(*status);
	
    nreq = sizeof(reqkeys)/sizeof(reqkeys[0][0])/2;
    nsp = sizeof(spkeys)/sizeof(spkeys[0][0])/2;

    /* construct translation patterns */

    for (ii = 0; ii < nreq; ii++) {
        patterns[ii][0] = reqkeys[ii][0];
	
        if (norec) 
            patterns[ii][1] = negative;
        else
            patterns[ii][1] = reqkeys[ii][1];
    }
    
    for (ii = 0; ii < nsp; ii++) {
        patterns[ii+nreq][0] = spkeys[ii][0];
        patterns[ii+nreq][1] = spkeys[ii][1];
    }

    npat = nreq + nsp;
    
    /* see if the EXTNAME keyword should be copied or not */
    fits_read_card(infptr, "EXTNAME", card, &tstatus);

    if (tstatus == 0) {
      if (!strncmp(card, "EXTNAME = 'COMPRESSED_IMAGE'", 28)) 
        patterns[npat-2][1] = negative;
    }
    
    /* translate and copy the keywords from the input file to the output */
    fits_translate_keywords(infptr, outfptr, 1, patterns, npat,
			    0, 0, 0, status);

    ffghsp(infptr, &nkeys, &nmore, status); /* get number of keywords in image */

    nmore = nmore / 36;  /* how many completely empty header blocks are there? */
     
    /* preserve the same number of spare header blocks in the output header */
     
    for (jj = 0; jj < nmore; jj++)
       for (ii = 0; ii < 36; ii++)
          fits_write_record(outfptr, "    ", status);


    return (*status);
}